

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall
mkvparser::Cues::Find(Cues *this,longlong time_ns,Track *pTrack,CuePoint **pCP,TrackPosition **pTP)

{
  CuePoint **ppCVar1;
  CuePoint *pCVar2;
  size_t sVar3;
  longlong lVar4;
  TrackPosition *pTVar5;
  CuePoint **ppCVar6;
  TrackPosition *pTVar7;
  CuePoint **ppCVar8;
  CuePoint **ppCVar9;
  long lVar10;
  CuePoint **ppCVar11;
  bool bVar12;
  
  if (((pTrack != (Track *)0x0 && -1 < time_ns) &&
      (ppCVar1 = this->m_cue_points, ppCVar1 != (CuePoint **)0x0)) &&
     (lVar10 = this->m_count, lVar10 != 0)) {
    pCVar2 = *ppCVar1;
    *pCP = pCVar2;
    if (pCVar2 != (CuePoint *)0x0) {
      lVar4 = CuePoint::GetTime(pCVar2,this->m_pSegment);
      if (lVar4 < time_ns) {
        ppCVar6 = ppCVar1 + lVar10;
        ppCVar9 = ppCVar1;
        ppCVar11 = ppCVar6;
        while (ppCVar9 < ppCVar11) {
          ppCVar8 = (CuePoint **)
                    ((((long)ppCVar11 - (long)ppCVar9 >> 3) -
                      ((long)ppCVar11 - (long)ppCVar9 >> 0x3f) & 0xfffffffffffffffeU) * 4 +
                    (long)ppCVar9);
          if ((ppCVar8 < ppCVar6) && (*ppCVar8 != (CuePoint *)0x0)) {
            lVar4 = CuePoint::GetTime(*ppCVar8,this->m_pSegment);
            if (lVar4 <= time_ns) {
              ppCVar9 = ppCVar8 + 1;
              ppCVar8 = ppCVar11;
            }
            bVar12 = ppCVar9 <= ppCVar8;
            ppCVar11 = ppCVar8;
          }
          else {
            bVar12 = false;
          }
          if (!bVar12) {
            return false;
          }
        }
        if (ppCVar9 <= ppCVar1) {
          return false;
        }
        if (ppCVar9 != ppCVar11) {
          return false;
        }
        if (ppCVar6 < ppCVar9) {
          return false;
        }
        pCVar2 = ppCVar9[-1];
        *pCP = pCVar2;
        if (pCVar2 == (CuePoint *)0x0) {
          return false;
        }
        lVar4 = CuePoint::GetTime(pCVar2,this->m_pSegment);
        if (time_ns < lVar4) {
          return false;
        }
        pTVar7 = (*pCP)->m_track_positions;
        sVar3 = (*pCP)->m_track_positions_count;
        pTVar5 = (TrackPosition *)(sVar3 * 8);
        lVar10 = sVar3 * 0x18;
        do {
          if (lVar10 == 0) goto LAB_001131f7;
          lVar10 = lVar10 + -0x18;
          bVar12 = pTVar7->m_track == (pTrack->m_info).number;
          if (bVar12) {
            pTVar5 = pTVar7;
          }
          pTVar7 = pTVar7 + 1;
        } while (!bVar12);
      }
      else {
        pTVar7 = (*pCP)->m_track_positions;
        sVar3 = (*pCP)->m_track_positions_count;
        pTVar5 = (TrackPosition *)(sVar3 * 8);
        lVar10 = sVar3 * 0x18;
        do {
          if (lVar10 == 0) goto LAB_001131f7;
          lVar10 = lVar10 + -0x18;
          bVar12 = pTVar7->m_track != (pTrack->m_info).number;
          if (!bVar12) {
            pTVar5 = pTVar7;
          }
          pTVar7 = pTVar7 + 1;
        } while (bVar12);
      }
      goto LAB_001131f9;
    }
  }
  return false;
LAB_001131f7:
  pTVar5 = (TrackPosition *)0x0;
LAB_001131f9:
  *pTP = pTVar5;
  return pTVar5 != (TrackPosition *)0x0;
}

Assistant:

bool Cues::Find(long long time_ns, const Track* pTrack, const CuePoint*& pCP,
                const CuePoint::TrackPosition*& pTP) const {
  if (time_ns < 0 || pTrack == NULL || m_cue_points == NULL || m_count == 0)
    return false;

  CuePoint** const ii = m_cue_points;
  CuePoint** i = ii;

  CuePoint** const jj = ii + m_count;
  CuePoint** j = jj;

  pCP = *i;
  if (pCP == NULL)
    return false;

  if (time_ns <= pCP->GetTime(m_pSegment)) {
    pTP = pCP->Find(pTrack);
    return (pTP != NULL);
  }

  while (i < j) {
    // INVARIANT:
    //[ii, i) <= time_ns
    //[i, j)  ?
    //[j, jj) > time_ns

    CuePoint** const k = i + (j - i) / 2;
    if (k >= jj)
      return false;

    CuePoint* const pCP = *k;
    if (pCP == NULL)
      return false;

    const long long t = pCP->GetTime(m_pSegment);

    if (t <= time_ns)
      i = k + 1;
    else
      j = k;

    if (i > j)
      return false;
  }

  if (i != j || i > jj || i <= ii)
    return false;

  pCP = *--i;

  if (pCP == NULL || pCP->GetTime(m_pSegment) > time_ns)
    return false;

  // TODO: here and elsewhere, it's probably not correct to search
  // for the cue point with this time, and then search for a matching
  // track.  In principle, the matching track could be on some earlier
  // cue point, and with our current algorithm, we'd miss it.  To make
  // this bullet-proof, we'd need to create a secondary structure,
  // with a list of cue points that apply to a track, and then search
  // that track-based structure for a matching cue point.

  pTP = pCP->Find(pTrack);
  return (pTP != NULL);
}